

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

int state_align_search_finish(ps_search_t *search)

{
  int iVar1;
  ps_alignment_entry_t *ppVar2;
  ps_alignment_iter_t *itor_00;
  state_align_hist_t local_50;
  state_align_hist_t cur;
  state_align_hist_t last;
  int cur_frame;
  int last_frame;
  ps_alignment_entry_t *ent;
  ps_alignment_iter_t *itor;
  hmm_t *final_phone;
  state_align_search_t *sas;
  ps_search_t *search_local;
  
  local_50.id = *(int32 *)(search[1].name + (long)*(int *)&search[1].acmod * 0x58 + -0x24);
  local_50.score = 0;
  cur.score = *(int32 *)(search[1].name + (long)*(int *)&search[1].acmod * 0x58 + -0x28);
  cur.id = local_50.id;
  if (local_50.id == 0xffffffff) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xe4,"Failed to reach final state in alignment\n");
    search_local._4_4_ = -1;
  }
  else {
    ent = (ps_alignment_entry_t *)ps_alignment_states((ps_alignment_t *)search[1].type);
    last.score = *(int *)((long)&search[1].acmod + 4) + 1;
    last.id = *(int *)((long)&search[1].acmod + 4);
    while (iVar1 = last.id, last.id = iVar1 + -1, -1 < last.id) {
      local_50 = *(state_align_hist_t *)
                  (&(search[1].d2p)->refcount +
                  (long)(last.id * *(int *)((long)&search[1].dict + 4) + local_50.id) * 2);
      if (local_50.id == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                ,0xec,"Alignment failed in frame %d\n",(ulong)(uint)last.id);
        return -1;
      }
      if (local_50.id != cur.id) {
        ent = (ps_alignment_entry_t *)ps_alignment_iter_goto((ps_alignment_iter_t *)ent,cur.id);
        if ((ps_alignment_iter_t *)ent == (ps_alignment_iter_t *)0x0) {
          __assert_fail("itor != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                        ,0xf2,"int state_align_search_finish(ps_search_t *)");
        }
        ppVar2 = ps_alignment_iter_get((ps_alignment_iter_t *)ent);
        ppVar2->start = iVar1;
        ppVar2->duration = last.score - ppVar2->start;
        ppVar2->score = cur.score - local_50.score;
        cur = local_50;
        last.score = iVar1;
      }
    }
    itor_00 = ps_alignment_iter_goto((ps_alignment_iter_t *)ent,0);
    if (itor_00 == (ps_alignment_iter_t *)0x0) {
      __assert_fail("itor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                    ,0xff,"int state_align_search_finish(ps_search_t *)");
    }
    ppVar2 = ps_alignment_iter_get(itor_00);
    ppVar2->start = 0;
    ppVar2->duration = last.score;
    ps_alignment_iter_free(itor_00);
    ps_alignment_propagate((ps_alignment_t *)search[1].type);
    search_local._4_4_ = 0;
  }
  return search_local._4_4_;
}

Assistant:

static int
state_align_search_finish(ps_search_t *search)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    hmm_t *final_phone = sas->hmms + sas->n_phones - 1;
    ps_alignment_iter_t *itor;
    ps_alignment_entry_t *ent;

    int last_frame, cur_frame;
    state_align_hist_t last, cur;

    /* Best state exiting the last cur_frame. */
    last.id = cur.id = hmm_out_history(final_phone);
    last.score = hmm_out_score(final_phone);
    if (last.id == -1) {
        E_ERROR("Failed to reach final state in alignment\n");
        return -1;
    }
    itor = ps_alignment_states(sas->al);
    last_frame = sas->frame + 1;
    for (cur_frame = sas->frame - 1; cur_frame >= 0; --cur_frame) {
	cur = sas->tokens[cur_frame * sas->n_emit_state + cur.id];
        if (cur.id == -1) {
            E_ERROR("Alignment failed in frame %d\n", cur_frame);
            return -1;
        }
        /* State boundary, update alignment entry for next state. */
        if (cur.id != last.id) {
            itor = ps_alignment_iter_goto(itor, last.id);
            assert(itor != NULL);
            ent = ps_alignment_iter_get(itor);
            ent->start = cur_frame + 1;
            ent->duration = last_frame - ent->start;
            ent->score =  last.score - cur.score;
            E_DEBUG("state %d start %d end %d\n", last.id,
                    ent->start, last_frame);
    	    last = cur;
            last_frame = cur_frame + 1;
        }
    }
    /* Update alignment entry for initial state. */
    itor = ps_alignment_iter_goto(itor, 0);
    assert(itor != NULL);
    ent = ps_alignment_iter_get(itor);
    ent->start = 0;
    ent->duration = last_frame;
    E_DEBUG("state %d start %d end %d\n", 0,
            ent->start, last_frame);
    ps_alignment_iter_free(itor);
    ps_alignment_propagate(sas->al);

    return 0;
}